

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry * NscBuildStruct(CNscPStackEntry *pId,CNscPStackEntry *pList)

{
  NscSymbol *pNVar1;
  NscMessage nMessage;
  
  if (pId == (CNscPStackEntry *)0x0) {
    __assert_fail("pId",
                  "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                  ,0x9c9,"CNscPStackEntry *NscBuildStruct(CNscPStackEntry *, CNscPStackEntry *)");
  }
  if (pList != (CNscPStackEntry *)0x0) {
    if (((pList->m_nType != NscType_Error) && (pId->m_nType != NscType_Error)) &&
       (g_pCtx->m_fPhase2 == false)) {
      pNVar1 = CNscContext::FindStructTagSymbol(g_pCtx,pId->m_pszId);
      if (pNVar1 == (NscSymbol *)0x0) {
        CNscContext::AddStructure(g_pCtx,pId->m_pszId,pList->m_pauchData,pList->m_nDataSize);
      }
      else {
        if (pNVar1->nSymType == NscSymType_Structure) {
          nMessage = NscMessage_ErrorStructureRedefined;
        }
        else {
          nMessage = NscMessage_ErrorStructSymbolTypeMismatch;
        }
        CNscContext::GenerateMessage(g_pCtx,nMessage,pId->m_pszId,pNVar1);
      }
    }
    CNwnDoubleLinkList::InsertAfter(&pId->m_link,&g_pCtx->m_listEntryFree);
    CNwnDoubleLinkList::InsertAfter(&pList->m_link,&g_pCtx->m_listEntryFree);
    return (CNscPStackEntry *)0x0;
  }
  __assert_fail("pList",
                "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                ,0x9ca,"CNscPStackEntry *NscBuildStruct(CNscPStackEntry *, CNscPStackEntry *)");
}

Assistant:

YYSTYPE NscBuildStruct (YYSTYPE pId, YYSTYPE pList)
{
	assert (pId);
	assert (pList);

	//
	// Check for silent errors
	//

	if (pList ->GetType () == NscType_Error ||
		pId ->GetType () == NscType_Error)
	{
	}

	//
	// Add the structure
	//

	else
	{
		if (!g_pCtx ->IsPhase2 ())
		{
			NscSymbol *pSymbol;
			bool fProblem;

			pSymbol = g_pCtx ->FindStructTagSymbol (pId ->GetIdentifier ());
			fProblem = false;

			//
			// Check that the symbol is not already defined.  Note that the
			// standard compiler silently allows this in some cases but does
			// not function correctly.  It's best to just flag this as a hard
			// error as the standard scripts do not have the problem.
			//

			if (pSymbol != NULL)
			{
				if (pSymbol ->nSymType == NscSymType_Structure)
				{
					g_pCtx ->GenerateMessage (NscMessage_ErrorStructureRedefined,
						pId ->GetIdentifier (), pSymbol);
					fProblem = true;
				}
				else
				{
					g_pCtx ->GenerateMessage (
						NscMessage_ErrorStructSymbolTypeMismatch,
						pId ->GetIdentifier (), pSymbol);
					fProblem = true;
				}
			}

			if (!fProblem)
			{
				g_pCtx ->AddStructure (pId ->GetIdentifier (),
					pList ->GetData (), pList ->GetDataSize ());
			}
		}
	}

	//
	// Rundown
	//

    g_pCtx ->FreePStackEntry (pId);
    g_pCtx ->FreePStackEntry (pList);
	return NULL;
}